

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcpr(fitsfile *infptr,fitsfile *outfptr,int cpopt,HDUtracker *HDU,int *status)

{
  int iVar1;
  int iVar2;
  fitsfile *in_RCX;
  int in_EDX;
  fitsfile *in_RSI;
  HDUtracker *in_R8;
  fitsfile *mfptr;
  char *excludeList [8];
  char *includeList [1];
  char *tkeyvalue;
  char comment [81];
  char card [81];
  char keyvalue [71];
  char keyword [75];
  long newTfields;
  long tfields;
  long nmembers;
  int newPosition;
  int startSearch;
  int keypos;
  int numkeys;
  int groupHDUnum;
  int hdutype;
  int nexclude;
  int i;
  char *in_stack_000005e8;
  undefined4 in_stack_000005f0;
  int in_stack_000005f4;
  HDUtracker *in_stack_000005f8;
  fitsfile *in_stack_00000600;
  int *in_stack_000017e0;
  fitsfile **in_stack_000017e8;
  long in_stack_000017f0;
  fitsfile *in_stack_000017f8;
  int *in_stack_000025e0;
  int in_stack_000025ec;
  fitsfile *in_stack_000025f0;
  fitsfile *in_stack_000025f8;
  HDUtracker *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined2 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffdcf;
  char *grpname;
  uint in_stack_fffffffffffffddc;
  undefined1 local_218 [16];
  int *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  long *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  fitsfile *in_stack_fffffffffffffe18;
  int *in_stack_fffffffffffffe20;
  int *exttype;
  undefined4 local_1d0;
  int in_stack_fffffffffffffe34;
  fitsfile *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe48;
  long *in_stack_fffffffffffffe50;
  fitsfile *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  fitsfile *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  char **in_stack_fffffffffffffe90;
  char local_168 [4];
  int in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea1;
  undefined6 in_stack_fffffffffffffea2;
  fitsfile *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  char **in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  char local_108 [64];
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int local_50;
  int local_4c;
  undefined4 uVar4;
  undefined4 uVar5;
  int local_40;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar9;
  
  uVar7 = 8;
  iVar6 = 0;
  local_40 = 0;
  uVar5 = 0;
  uVar4 = 0;
  local_4c = 0;
  local_50 = 0;
  exttype = (int *)0x26c85b;
  memcpy(local_218,&PTR_anon_var_dwarf_9fa_00288980,0x40);
  if (in_R8->nHDU != 0) {
    return in_R8->nHDU;
  }
  iVar1 = ffgtnm(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  in_R8->nHDU = iVar1;
  iVar1 = ffgkys(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 (char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 in_stack_fffffffffffffdf8);
  in_R8->nHDU = iVar1;
  if (in_R8->nHDU == 0xca) {
    local_108[0] = '\0';
    in_R8->nHDU = 0;
  }
  grpname = local_108;
  prepare_keyvalue((char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  iVar1 = ffgtcr((fitsfile *)((ulong)in_stack_fffffffffffffddc << 0x20),grpname,
                 CONCAT13(in_stack_fffffffffffffdcf,
                          CONCAT12(in_stack_fffffffffffffdce,in_stack_fffffffffffffdcc)),
                 (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  in_R8->nHDU = iVar1;
  ffghdn(in_RSI,&local_40);
  iVar1 = fftsud(in_stack_00000600,in_stack_000005f8,in_stack_000005f4,in_stack_000005e8);
  in_R8->nHDU = iVar1;
  if (in_EDX == 0) {
    iVar6 = 1;
    while( true ) {
      uVar3 = false;
      if (iVar6 < 1) {
        uVar3 = in_R8->nHDU == 0;
      }
      if ((bool)uVar3 == false) break;
      iVar1 = ffgmop(in_stack_000017f8,in_stack_000017f0,in_stack_000017e8,in_stack_000017e0);
      in_R8->nHDU = iVar1;
      iVar1 = ffgtam(in_stack_000025f8,in_stack_000025f0,in_stack_000025ec,in_stack_000025e0);
      in_R8->nHDU = iVar1;
      ffclos((fitsfile *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffdce,
                                     CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)))
             ,(int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      iVar6 = iVar6 + 1;
    }
    in_stack_fffffffffffffdcf = 0;
  }
  else if (in_EDX == 2) {
    iVar1 = 1;
    uVar9 = 2;
    while( true ) {
      uVar3 = false;
      if (iVar1 < 1) {
        uVar3 = in_R8->nHDU == 0;
      }
      if ((bool)uVar3 == false) break;
      iVar2 = ffgmop(in_stack_000017f8,in_stack_000017f0,in_stack_000017e8,in_stack_000017e0);
      in_R8->nHDU = iVar2;
      if (in_R8->nHDU == 0) {
        iVar2 = fftsad(in_stack_00000600,in_stack_000005f8,
                       (int *)CONCAT44(in_stack_000005f4,in_stack_000005f0),in_stack_000005e8);
        in_R8->nHDU = iVar2;
        if (in_R8->nHDU == 0x15a) {
          in_R8->nHDU = 0;
          iVar2 = ffgtam(in_stack_000025f8,in_stack_000025f0,in_stack_000025ec,in_stack_000025e0);
          in_R8->nHDU = iVar2;
          ffclos((fitsfile *)
                 CONCAT17(in_stack_fffffffffffffdcf,
                          CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffdcc,
                                                  in_stack_fffffffffffffdc8))),
                 (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        }
        else if (in_R8->nHDU == 0) {
          iVar2 = ffgkys(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         (char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8);
          in_R8->nHDU = iVar2;
          if (in_R8->nHDU == 0xca) {
            local_108[0] = '\0';
            in_R8->nHDU = 0;
          }
          prepare_keyvalue((char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
          iVar2 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                   CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffdcc
                                                                           ,
                                                  in_stack_fffffffffffffdc8))),
                                  (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
          if (iVar2 == 0) {
            iVar2 = ffgtcpr(in_RSI,(fitsfile *)CONCAT44(uVar9,in_stack_ffffffffffffffe0),
                            (int)((ulong)in_RCX >> 0x20),in_R8,(int *)CONCAT44(iVar1,uVar7));
            in_R8->nHDU = iVar2;
          }
          else {
            iVar2 = ffgmcp(in_RCX,(fitsfile *)in_R8,CONCAT44(iVar1,uVar7),iVar6,
                           (int *)CONCAT44(uVar5,uVar4));
            in_R8->nHDU = iVar2;
          }
          ffghdn(in_RSI,&local_50);
          iVar2 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                   CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffdcc
                                                                           ,
                                                  in_stack_fffffffffffffdc8))),
                                  (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
          if (iVar2 != 0) {
            iVar2 = fftsud(in_stack_00000600,in_stack_000005f8,in_stack_000005f4,in_stack_000005e8);
            in_R8->nHDU = iVar2;
          }
          iVar2 = ffmahd(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,exttype,
                         in_stack_fffffffffffffe20);
          in_R8->nHDU = iVar2;
          iVar2 = ffgtam(in_stack_000025f8,in_stack_000025f0,in_stack_000025ec,in_stack_000025e0);
          in_R8->nHDU = iVar2;
          ffclos((fitsfile *)
                 CONCAT17(in_stack_fffffffffffffdcf,
                          CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffdcc,
                                                  in_stack_fffffffffffffdc8))),
                 (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        }
      }
      iVar1 = iVar1 + 1;
    }
    in_stack_fffffffffffffdce = 0;
  }
  else {
    in_R8->nHDU = 0x15b;
    ffpmsg((char *)0x1c8a5e);
  }
  if (in_R8->nHDU == 0) {
    ffmahd(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,exttype,in_stack_fffffffffffffe20);
    iVar6 = ffgcrd(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   (char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    in_R8->nHDU = iVar6;
    iVar6 = ffghps((fitsfile *)
                   CONCAT17(in_stack_fffffffffffffdcf,
                            CONCAT16(in_stack_fffffffffffffdce,
                                     CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)))
                   ,(int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   &in_stack_fffffffffffffdb8->nHDU,(int *)0x1c8ae9);
    in_R8->nHDU = iVar6;
    local_4c = 8;
    while (in_R8->nHDU == 0) {
      ffgrec((fitsfile *)
             CONCAT17(in_stack_fffffffffffffdcf,
                      CONCAT16(in_stack_fffffffffffffdce,
                               CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))),
             in_stack_fffffffffffffdc4,(char *)in_stack_fffffffffffffdb8,(int *)0x1c8b46);
      in_stack_fffffffffffffdb8 = in_R8;
      in_R8 = in_stack_fffffffffffffdb8;
      iVar6 = ffgnxk(in_stack_fffffffffffffea8,
                     (char **)CONCAT62(in_stack_fffffffffffffea2,
                                       CONCAT11(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0)
                                      ),in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,in_stack_fffffffffffffec0);
      in_R8->nHDU = iVar6;
      iVar6 = ffghps((fitsfile *)
                     CONCAT17(in_stack_fffffffffffffdcf,
                              CONCAT16(in_stack_fffffffffffffdce,
                                       CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                                      )),
                     (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     &in_stack_fffffffffffffdb8->nHDU,(int *)0x1c8baf);
      in_R8->nHDU = iVar6;
      local_4c = local_4c + -1;
      iVar6 = strncmp(local_168,"GRPLC",5);
      if (iVar6 == 0) {
        iVar6 = ffgrec((fitsfile *)
                       CONCAT17(in_stack_fffffffffffffdcf,
                                CONCAT16(in_stack_fffffffffffffdce,
                                         CONCAT24(in_stack_fffffffffffffdcc,
                                                  in_stack_fffffffffffffdc8))),
                       in_stack_fffffffffffffdc4,(char *)in_stack_fffffffffffffdb8,(int *)0x1c8c43);
        in_R8->nHDU = iVar6;
        in_stack_fffffffffffffea1 = 0;
        iVar6 = ffgkls(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                       ,(char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        in_R8->nHDU = iVar6;
        if (in_R8->nHDU == 0) {
          ffikls(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          ffplsw(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          free((void *)CONCAT44(in_stack_fffffffffffffe34,local_1d0));
        }
      }
      else {
        iVar6 = ffirec((fitsfile *)
                       CONCAT17(in_stack_fffffffffffffdcf,
                                CONCAT16(in_stack_fffffffffffffdce,
                                         CONCAT24(in_stack_fffffffffffffdcc,
                                                  in_stack_fffffffffffffdc8))),
                       in_stack_fffffffffffffdc4,(char *)in_stack_fffffffffffffdb8,(int *)0x1c8c0e);
        in_R8->nHDU = iVar6;
      }
    }
    if (in_R8->nHDU == 0xca) {
      in_R8->nHDU = 0;
    }
    else if (in_R8->nHDU != 0) goto LAB_001c8f67;
    iVar6 = ffgkyj(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    in_R8->nHDU = iVar6;
    iVar6 = ffgkyj(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    in_R8->nHDU = iVar6;
    for (uVar8 = 1; (int)uVar8 < 1; uVar8 = uVar8 + 1) {
      snprintf(&stack0xffffffffffffff48,0x4b,"TTYPE%d",(ulong)uVar8);
      iVar6 = ffgkys(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                     (char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdf8);
      in_R8->nHDU = iVar6;
      if (in_R8->nHDU == 0xca) {
        in_R8->nHDU = 0;
        local_108[0] = '\0';
      }
      prepare_keyvalue((char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                               CONCAT16(in_stack_fffffffffffffdce,
                                                        CONCAT24(in_stack_fffffffffffffdcc,
                                                                 in_stack_fffffffffffffdc8))),
                              (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
      ;
      if ((((iVar6 != 0) &&
           (iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                     CONCAT16(in_stack_fffffffffffffdce,
                                                              CONCAT24(in_stack_fffffffffffffdcc,
                                                                       in_stack_fffffffffffffdc8))),
                                    (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                     in_stack_fffffffffffffdc0)), iVar6 != 0)) &&
          (iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                    CONCAT16(in_stack_fffffffffffffdce,
                                                             CONCAT24(in_stack_fffffffffffffdcc,
                                                                      in_stack_fffffffffffffdc8))),
                                   (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                    in_stack_fffffffffffffdc0)), iVar6 != 0)) &&
         (((iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                     CONCAT16(in_stack_fffffffffffffdce,
                                                              CONCAT24(in_stack_fffffffffffffdcc,
                                                                       in_stack_fffffffffffffdc8))),
                                    (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                     in_stack_fffffffffffffdc0)), iVar6 != 0 &&
           (iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                     CONCAT16(in_stack_fffffffffffffdce,
                                                              CONCAT24(in_stack_fffffffffffffdcc,
                                                                       in_stack_fffffffffffffdc8))),
                                    (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                     in_stack_fffffffffffffdc0)), iVar6 != 0)) &&
          (iVar6 = fits_strcasecmp((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                                    CONCAT16(in_stack_fffffffffffffdce,
                                                             CONCAT24(in_stack_fffffffffffffdcc,
                                                                      in_stack_fffffffffffffdc8))),
                                   (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                    in_stack_fffffffffffffdc0)), iVar6 != 0)))) {
        iVar6 = ffcpcl((fitsfile *)comment._40_8_,(fitsfile *)comment._32_8_,comment._28_4_,
                       comment._24_4_,comment._20_4_,(int *)comment._8_8_);
        in_R8->nHDU = iVar6;
      }
    }
  }
LAB_001c8f67:
  return in_R8->nHDU;
}

Assistant:

int ffgtcpr(fitsfile   *infptr,  /* input FITS file pointer                 */
	    fitsfile   *outfptr, /* output FITS file pointer                */
	    int         cpopt,   /* code specifying copy options:
				    OPT_GCP_GPT (0) ==> cp only grouping table
				    OPT_GCP_ALL (2) ==> recusrively copy 
				    members and their members (if groups)   */
	    HDUtracker *HDU,     /* list of already copied HDUs             */
	    int        *status)  /* return status code                      */

/*
  copy a Group to a new FITS file. If the cpopt parameter is set to 
  OPT_GCP_GPT (copy grouping table only) then the existing members have their 
  GRPIDn and GRPLCn keywords updated to reflect the existance of the new group,
  since they now belong to another group. If cpopt is set to OPT_GCP_ALL 
  (copy grouping table and members recursively) then the original members are 
  not updated; the new grouping table is modified to include only the copied 
  member HDUs and not the original members.

  Note that this function is recursive. When copt is OPT_GCP_ALL it will call
  itself whenever a member HDU of the current grouping table is itself a
  grouping table (i.e., EXTNAME = 'GROUPING').
*/

{

  int i;
  int nexclude     = 8;
  int hdutype      = 0;
  int groupHDUnum  = 0;
  int numkeys      = 0;
  int keypos       = 0;
  int startSearch  = 0;
  int newPosition  = 0;

  long nmembers    = 0;
  long tfields     = 0;
  long newTfields  = 0;

  char keyword[FLEN_KEYWORD];
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char comment[FLEN_CARD];
  char *tkeyvalue;

  char *includeList[] = {"*"};
  char *excludeList[] = {"EXTNAME","EXTVER","GRPNAME","GRPID#","GRPLC#",
			 "THEAP","TDIM#","T????#"};

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	create a new grouping table in the FITS file pointed to by outptr
      */

      *status = fits_get_num_members(infptr,&nmembers,status);

      *status = fits_read_key_str(infptr,"GRPNAME",keyvalue,card,status);

      if(*status == KEY_NO_EXIST)
	{
	  keyvalue[0] = 0;
	  *status     = 0;
	}
      prepare_keyvalue(keyvalue);

      *status = fits_create_group(outfptr,keyvalue,GT_ID_ALL_URI,status);
     
      /* save the new grouping table's HDU position for future use */

      fits_get_hdu_num(outfptr,&groupHDUnum);

      /* update the HDUtracker struct with the grouping table's new position */
      
      *status = fftsud(infptr,HDU,groupHDUnum,NULL);

      /*
	Now populate the copied grouping table depending upon the 
	copy option parameter value
      */

      switch(cpopt)
	{

	  /*
	    for the "copy grouping table only" option we only have to
	    add the members of the original grouping table to the new
	    grouping table
	  */

	case OPT_GCP_GPT:

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      *status = fits_open_member(infptr,i,&mfptr,status);
	      *status = fits_add_group_member(outfptr,mfptr,0,status);

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	case OPT_GCP_ALL:
      
	  /*
	    for the "copy the entire group" option
 	  */

	  /* loop over all the grouping table members */

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      /* open the ith member */

	      *status = fits_open_member(infptr,i,&mfptr,status);

	      if(*status != 0) continue;

	      /* add it to the HDUtracker struct */

	      *status = fftsad(mfptr,HDU,&newPosition,NULL);

	      /* if already copied then just add the member to the group */

	      if(*status == HDU_ALREADY_TRACKED)
		{
		  *status = 0;
		  *status = fits_add_group_member(outfptr,NULL,newPosition,
						  status);
		  fits_close_file(mfptr,status);
                  mfptr = NULL;
		  continue;
		}
	      else if(*status != 0) continue;

	      /* see if the member is a grouping table */

	      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,
					  status);

	      if(*status == KEY_NO_EXIST)
		{
		  keyvalue[0] = 0;
		  *status     = 0;
		}
	      prepare_keyvalue(keyvalue);

	      /*
		if the member is a grouping table then copy it and all of
		its members using ffgtcpr(), else copy it using
		fits_copy_member(); the outptr will point to the newly
		copied member upon return from both functions
	      */

	      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
		*status = ffgtcpr(mfptr,outfptr,OPT_GCP_ALL,HDU,status);
	      else
		*status = fits_copy_member(infptr,outfptr,i,OPT_MCP_NADD,
					   status);

	      /* retrieve the position of the newly copied member */

	      fits_get_hdu_num(outfptr,&newPosition);

	      /* update the HDUtracker struct with member's new position */
	      
	      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
		*status = fftsud(mfptr,HDU,newPosition,NULL);

	      /* move the outfptr back to the copied grouping table HDU */

	      *status = fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

	      /* add the copied member HDU to the copied grouping table */

	      *status = fits_add_group_member(outfptr,NULL,newPosition,status);

	      /* close the mfptr pointer */

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	default:
	  
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for cmopt parameter (ffgtcpr)");
	  break;
	}

      if(*status != 0) continue; 

      /* 
	 reposition the outfptr to the grouping table so that the grouping
	 table is the CHDU upon return to the calling function
      */

      fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

      /*
	 copy all auxiliary keyword records from the original grouping table
	 to the new grouping table; they are copied in their original order
	 and inserted just before the TTYPE1 keyword record
      */

      *status = fits_read_card(outfptr,"TTYPE1",card,status);
      *status = fits_get_hdrpos(outfptr,&numkeys,&keypos,status);
      --keypos;

      startSearch = 8;

      while(*status == 0)
	{
	  ffgrec(infptr,startSearch,card,status);

	  *status = fits_find_nextkey(infptr,includeList,1,excludeList,
				      nexclude,card,status);

	  *status = fits_get_hdrpos(infptr,&numkeys,&startSearch,status);

	  --startSearch;
	  /* SPR 1738 */
	  if (strncmp(card,"GRPLC",5)) {
	    /* Not going to be a long string so we're ok */
	    *status = fits_insert_record(outfptr,keypos,card,status);
	  } else {
	    /* We could have a long string */
	    *status = fits_read_record(infptr,startSearch,card,status);
	    card[9] = '\0';
	    *status = fits_read_key_longstr(infptr,card,&tkeyvalue,comment,
					    status);
	    if (0 == *status) {
	      fits_insert_key_longstr(outfptr,card,tkeyvalue,comment,status);
	      fits_write_key_longwarn(outfptr,status);
	      free(tkeyvalue);
	    }
	  }
	  
	  ++keypos;
	}
      
	  
      if(*status == KEY_NO_EXIST) 
	*status = 0;
      else if(*status != 0) continue;

      /*
	 search all the columns of the original grouping table and copy
	 those to the new grouping table that were not part of the grouping
	 convention. Note that is legal to have additional columns in a
	 grouping table. Also note that the order of the columns may
	 not be the same in the original and copied grouping table.
      */

      /* retrieve the number of columns in the original and new group tables */

      *status = fits_read_key_lng(infptr,"TFIELDS",&tfields,card,status);
      *status = fits_read_key_lng(outfptr,"TFIELDS",&newTfields,card,status);

      for(i = 1; i <= tfields; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"TTYPE%d",i);
	  *status = fits_read_key_str(infptr,keyword,keyvalue,card,status);
	  
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
              keyvalue[0] = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  if(fits_strcasecmp(keyvalue,"MEMBER_XTENSION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_NAME")     != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_VERSION")  != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_POSITION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_LOCATION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_URI_TYPE") != 0   )
	    {
 
	      /* SPR 3956, add at the end of the table */
	      *status = fits_copy_col(infptr,outfptr,i,newTfields+1,1,status);
	      ++newTfields;
	    }
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}